

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O1

int testArgumentParser(int param_1,char **param_2)

{
  bool bVar1;
  cmArgumentParser<void> *pcVar2;
  ostream *poVar3;
  _Rb_tree_node_base *unparsedArguments_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args_00;
  long lVar4;
  char *pcVar5;
  size_t pos;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  static_string_view name_15;
  static_string_view name_16;
  static_string_view name_17;
  static_string_view name_18;
  static_string_view name_19;
  static_string_view name_20;
  static_string_view name_21;
  static_string_view name_22;
  static_string_view name_23;
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  func4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments_1;
  Result result;
  _Any_data local_598;
  code *local_588;
  code *pcStack_580;
  _Rb_tree_node_base local_578;
  _Any_data local_558;
  code *local_548;
  _Any_data local_538;
  code *local_528;
  undefined1 local_518 [16];
  pointer local_508;
  _Any_data _Stack_500;
  _Manager_type p_Stack_4f0;
  _Invoker_type local_4e8;
  _Any_data _Stack_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4d0;
  undefined1 auStack_4c0 [24];
  undefined1 local_4a8 [24];
  code *pcStack_490;
  _Any_data local_488;
  code *local_478;
  code *pcStack_470;
  undefined1 local_468 [16];
  code *local_458;
  code *pcStack_450;
  undefined1 local_448 [16];
  code *local_438;
  code *pcStack_430;
  undefined1 local_428 [16];
  code *local_418;
  code *pcStack_410;
  undefined1 local_400 [48];
  undefined1 local_3d0 [24];
  _Any_data local_3b8;
  pointer local_3a8;
  bool local_3a0;
  bool local_39f [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_328;
  NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_298;
  optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_258;
  optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_238;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_218;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_200;
  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1e8;
  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1c8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158 [7];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_20;
  
  anon_unknown.dwarf_12e44::Result::Result((Result *)local_3d0);
  local_578._M_color = _S_red;
  local_578._4_4_ = 0;
  local_578._M_parent = (_Base_ptr)0x0;
  local_578._M_left = (_Base_ptr)0x0;
  local_598._8_8_ = 0;
  pcStack_580 = std::
                _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:256:13)>
                ::_M_invoke;
  local_588 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:256:13)>
              ::_M_manager;
  auStack_4c0._8_8_ = (pointer)0x0;
  auStack_4c0._16_8_ = (pointer)0x0;
  aStack_4d0._8_8_ = (_Invoker_type)0x0;
  auStack_4c0._0_8_ = (pointer)0x0;
  _Stack_4e0._8_8_ = 0;
  aStack_4d0._M_allocated_capacity = 0;
  local_4e8 = (_Invoker_type)0x0;
  _Stack_4e0._M_unused._M_object = (void *)0x0;
  _Stack_500._8_8_ = 0;
  p_Stack_4f0 = (_Manager_type)0x0;
  local_508 = (pointer)0x0;
  _Stack_500._M_unused._M_object = (void *)0x0;
  local_518._0_8_ = (pointer)0x0;
  local_518._8_8_ = (pointer)0x0;
  local_598._M_unused._M_object = (Result *)local_3d0;
  pcVar2 = cmArgumentParser<void>::Bind((cmArgumentParser<void> *)local_518,0,&local_1a8);
  pcVar2 = cmArgumentParser<void>::Bind(pcVar2,1,&local_180);
  pcVar2 = cmArgumentParser<void>::Bind(pcVar2,2,local_158);
  name.super_string_view._M_str = "OPTION_1";
  name.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<bool>(pcVar2,name,&local_3a0);
  name_00.super_string_view._M_str = "OPTION_2";
  name_00.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<bool>(pcVar2,name_00,local_39f);
  name_01.super_string_view._M_str = "STRING_1";
  name_01.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<std::__cxx11::string>(pcVar2,name_01,&local_398);
  name_02.super_string_view._M_str = "STRING_2";
  name_02.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar2,name_02,&local_378);
  name_03.super_string_view._M_str = "STRING_3";
  name_03.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<std::optional<std::__cxx11::string>>
                     (pcVar2,name_03,&local_350);
  name_04.super_string_view._M_str = "STRING_4";
  name_04.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<ArgumentParser::Maybe<std::__cxx11::string>>
                     (pcVar2,name_04,&local_328);
  name_05.super_string_view._M_str = "STRING_5";
  name_05.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<ArgumentParser::NonEmpty<std::__cxx11::string>>
                     (pcVar2,name_05,&local_308);
  name_06.super_string_view._M_str = "STRING_6";
  name_06.super_string_view._M_len = 8;
  pcVar2 = cmArgumentParser<void>::Bind<ArgumentParser::NonEmpty<std::__cxx11::string>>
                     (pcVar2,name_06,&local_2e8);
  name_07.super_string_view._M_str = "LIST_1";
  name_07.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (pcVar2,name_07,&local_2c8);
  name_08.super_string_view._M_str = "LIST_2";
  name_08.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (pcVar2,name_08,&local_2b0);
  name_09.super_string_view._M_str = "LIST_3";
  name_09.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_09,&local_298);
  name_10.super_string_view._M_str = "LIST_4";
  name_10.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_10,&local_278);
  name_11.super_string_view._M_str = "LIST_5";
  name_11.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_11,&local_258);
  name_12.super_string_view._M_str = "LIST_6";
  name_12.super_string_view._M_len = 6;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_12,&local_238);
  name_13.super_string_view._M_str = "MULTI_1";
  name_13.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_13,&local_218);
  name_14.super_string_view._M_str = "MULTI_2";
  name_14.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                     (pcVar2,name_14,&local_200);
  name_15.super_string_view._M_str = "MULTI_3";
  name_15.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                     (pcVar2,name_15,&local_1e8);
  name_16.super_string_view._M_str = "MULTI_4";
  name_16.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::
           Bind<std::optional<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                     (pcVar2,name_16,&local_1c8);
  local_428._8_8_ = 0;
  pcStack_410 = std::
                _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:285:13)>
                ::_M_invoke;
  local_418 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:285:13)>
              ::_M_manager;
  name_17.super_string_view._M_str = "FUNC_0";
  name_17.super_string_view._M_len = 6;
  local_428._0_8_ = (Result *)local_3d0;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_17,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_428,(ExpectAtLeast)0x1);
  local_448._8_8_ = 0;
  pcStack_430 = std::
                _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:289:13)>
                ::_M_invoke;
  local_438 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:289:13)>
              ::_M_manager;
  name_18.super_string_view._M_str = "FUNC_1";
  name_18.super_string_view._M_len = 6;
  local_448._0_8_ = (Result *)local_3d0;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_18,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_448,(ExpectAtLeast)0x1);
  local_468._8_8_ = 0;
  pcStack_450 = std::
                _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:293:13)>
                ::_M_invoke;
  local_458 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:293:13)>
              ::_M_manager;
  name_19.super_string_view._M_str = "FUNC_2a";
  name_19.super_string_view._M_len = 7;
  local_468._0_8_ = (Result *)local_3d0;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_19,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_468,(ExpectAtLeast)0x1);
  local_488._8_8_ = 0;
  pcStack_470 = std::
                _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:296:13)>
                ::_M_invoke;
  local_478 = std::
              _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:296:13)>
              ::_M_manager;
  name_20.super_string_view._M_str = "FUNC_2b";
  name_20.super_string_view._M_len = 7;
  local_488._M_unused._M_object = (Result *)local_3d0;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_20,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_488,(ExpectAtLeast)0x1);
  local_4a8._8_8_ = 0;
  pcStack_490 = std::
                _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:299:13)>
                ::_M_invoke;
  local_4a8._16_8_ =
       std::
       _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testArgumentParser.cxx:299:13)>
       ::_M_manager;
  name_21.super_string_view._M_str = "FUNC_3";
  name_21.super_string_view._M_len = 6;
  local_4a8._0_8_ = (Result *)local_3d0;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_21,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_4a8,(ExpectAtLeast)0x1);
  std::
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_538,
             (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_598);
  name_22.super_string_view._M_str = "FUNC_4a";
  name_22.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_22,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_538,(ExpectAtLeast)0x1);
  std::
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_558,
             (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_598);
  name_23.super_string_view._M_str = "FUNC_4b";
  name_23.super_string_view._M_len = 7;
  pcVar2 = cmArgumentParser<void>::Bind
                     (pcVar2,name_23,
                      (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_558,(ExpectAtLeast)0x1);
  pcVar2 = cmArgumentParser<void>::BindParsedKeywords(pcVar2,&local_20);
  unparsedArguments_00 = &local_578;
  pos = 0;
  cmArgumentParser<void>::
  Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
            ((ParseResult *)local_400,pcVar2,
             (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             (anonymous_namespace)::args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)unparsedArguments_00,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_3d0);
  if ((pointer)local_400._16_8_ != (pointer)0x0) {
    unparsedArguments_00 = (_Rb_tree_node_base *)(local_3d0 + 8);
    local_3d0._8_4_ = local_400._8_4_;
    local_3d0._16_8_ = local_400._16_8_;
    local_3b8._M_unused._M_object = (void *)local_400._24_8_;
    local_3b8._8_8_ = local_400._32_8_;
    ((basic_string_view<char,_std::char_traits<char>_> *)local_400._16_8_)->_M_str =
         (char *)unparsedArguments_00;
    local_3a8 = (pointer)local_400._40_8_;
    local_400._16_8_ = (pointer)0x0;
    local_400._40_8_ = (pointer)0x0;
    local_400._24_8_ = (_Base_ptr)(local_400 + 8);
    local_400._32_8_ = (_Base_ptr)(local_400 + 8);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_400);
  if (local_548 != (code *)0x0) {
    (*local_548)(&local_558,&local_558,__destroy_functor);
  }
  if (local_528 != (code *)0x0) {
    (*local_528)(&local_538,&local_538,__destroy_functor);
  }
  if ((pointer)local_4a8._16_8_ != (pointer)0x0) {
    (*(code *)local_4a8._16_8_)(local_4a8,local_4a8,3);
  }
  if (local_478 != (code *)0x0) {
    (*local_478)(&local_488,&local_488,__destroy_functor);
  }
  if (local_458 != (_Manager_type)0x0) {
    (*local_458)(local_468,local_468,3);
  }
  if (local_438 != (_Manager_type)0x0) {
    (*local_438)(local_448,local_448,3);
  }
  if (local_418 != (_Manager_type)0x0) {
    (*local_418)(local_428,local_428,3);
  }
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
             *)auStack_4c0);
  if ((_Manager_type)aStack_4d0._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)aStack_4d0._M_allocated_capacity)(&_Stack_4e0,&_Stack_4e0,3);
  }
  if (p_Stack_4f0 != (_Manager_type)0x0) {
    (*p_Stack_4f0)(&_Stack_500,&_Stack_500,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)local_518);
  bVar1 = anon_unknown.dwarf_12e44::verifyResult
                    ((Result *)local_3d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_578);
  if (local_588 != (code *)0x0) {
    (*local_588)(&local_598,&local_598,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_578);
  anon_unknown.dwarf_12e44::Result::~Result((Result *)local_3d0);
  if (bVar1) {
    local_518._0_8_ = (pointer)0x0;
    local_518._8_8_ = (pointer)0x0;
    local_508 = (pointer)0x0;
    anon_unknown.dwarf_12e44::Result::Result((Result *)local_3d0);
    cmArgumentParser<(anonymous_namespace)::Result>::
    Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
              ((cmArgumentParser<(anonymous_namespace)::Result> *)local_3d0,(Result *)local_518,args
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)unparsedArguments_00,pos);
    bVar1 = anon_unknown.dwarf_12e44::verifyResult
                      ((Result *)local_3d0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_518);
    anon_unknown.dwarf_12e44::Result::~Result((Result *)local_3d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_518);
    if (bVar1) {
      local_518._0_8_ = (pointer)0x0;
      local_518._8_8_ = (pointer)0x0;
      local_508 = (pointer)0x0;
      anon_unknown.dwarf_12e44::Result::Result((Result *)local_3d0);
      bVar1 = cmArgumentParser<(anonymous_namespace)::Result>::
              Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
                        ((cmArgumentParser<(anonymous_namespace)::Result> *)local_3d0,
                         (Result *)local_518,args_00,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)unparsedArguments_00,pos);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(parserStatic.Parse(result, args, &unparsedArguments) == false) failed on line "
                   ,0x5a);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,0x16a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        anon_unknown.dwarf_12e44::Result::~Result((Result *)local_3d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_518);
      }
      else {
        bVar1 = anon_unknown.dwarf_12e44::verifyResult
                          ((Result *)local_3d0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_518);
        anon_unknown.dwarf_12e44::Result::~Result((Result *)local_3d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_518);
        if (bVar1) {
          return 0;
        }
      }
      pcVar5 = "While executing testArgumentParserStaticBool().\n";
      lVar4 = 0x30;
    }
    else {
      pcVar5 = "While executing testArgumentParserStatic().\n";
      lVar4 = 0x2c;
    }
  }
  else {
    pcVar5 = "While executing testArgumentParserDynamic().\n";
    lVar4 = 0x2d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  return -1;
}

Assistant:

int testArgumentParser(int /*unused*/, char* /*unused*/ [])
{
  if (!testArgumentParserDynamic()) {
    std::cout << "While executing testArgumentParserDynamic().\n";
    return -1;
  }

  if (!testArgumentParserStatic()) {
    std::cout << "While executing testArgumentParserStatic().\n";
    return -1;
  }

  if (!testArgumentParserStaticBool()) {
    std::cout << "While executing testArgumentParserStaticBool().\n";
    return -1;
  }

  return 0;
}